

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool google::protobuf::compiler::js::anon_unknown_0::ReturnsNullWhenUnset
               (GeneratorOptions *options,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  FieldDescriptor *in_RSI;
  GeneratorOptions *in_RDI;
  byte local_19;
  bool local_1;
  
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46f188);
  if ((CVar2 == CPPTYPE_MESSAGE) &&
     (bVar1 = FieldDescriptor::is_optional((FieldDescriptor *)0x46f197), bVar1)) {
    local_1 = true;
  }
  else {
    bVar1 = UseBrokenPresenceSemantics(in_RDI,in_RSI);
    local_19 = 0;
    if (bVar1) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46f1cc);
      local_19 = 0;
      if (!bVar1) {
        bVar1 = FieldDescriptor::has_default_value(in_RSI);
        local_19 = bVar1 ^ 0xff;
      }
    }
    local_1 = (bool)(local_19 & 1);
  }
  return local_1;
}

Assistant:

bool ReturnsNullWhenUnset(const GeneratorOptions& options,
                          const FieldDescriptor* field) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      field->is_optional()) {
    return true;
  }

  // TODO(haberman): remove this case and unconditionally return false.
  return UseBrokenPresenceSemantics(options, field) && !field->is_repeated() &&
         !field->has_default_value();
}